

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::DirectStateAccess::Buffers::ErrorsTest::iterate(ErrorsTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  int iVar15;
  ContextType ctxType;
  ApiType requiredApiType;
  RenderContext *pRVar16;
  undefined4 extraout_var;
  ContextInfo *this_00;
  undefined4 *puVar18;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  ErrorsTest *this_local;
  long lVar17;
  
  pRVar16 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar15 = (*pRVar16->_vptr_RenderContext[3])();
  lVar17 = CONCAT44(extraout_var,iVar15);
  pRVar16 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar16->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    this->m_pClearNamedBufferData = *(PFNGLCLEARNAMEDBUFFERDATA *)(lVar17 + 0x1d8);
    this->m_pClearNamedBufferSubData = *(PFNGLCLEARNAMEDBUFFERSUBDATA *)(lVar17 + 0x1e0);
    this->m_pCopyNamedBufferSubData = *(PFNGLCOPYNAMEDBUFFERSUBDATA *)(lVar17 + 0x340);
    this->m_pFlushMappedNamedBufferRange = *(PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE *)(lVar17 + 0x660);
    this->m_pGetNamedBufferParameteri64v = *(PFNGLGETNAMEDBUFFERPARAMETERI64V *)(lVar17 + 0x8f0);
    this->m_pGetNamedBufferParameteriv = *(PFNGLGETNAMEDBUFFERPARAMETERIV *)(lVar17 + 0x8f8);
    this->m_pGetNamedBufferPointerv = *(PFNGLGETNAMEDBUFFERPOINTERV *)(lVar17 + 0x900);
    this->m_pGetNamedBufferSubData = *(PFNGLGETNAMEDBUFFERSUBDATA *)(lVar17 + 0x908);
    this->m_pMapNamedBuffer = *(PFNGLMAPNAMEDBUFFER *)(lVar17 + 0xd08);
    this->m_pMapNamedBufferRange = *(PFNGLMAPNAMEDBUFFERRANGE *)(lVar17 + 0xd10);
    this->m_pNamedBufferData = *(PFNGLNAMEDBUFFERDATA *)(lVar17 + 0xec0);
    this->m_pNamedBufferStorage = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar17 + 0xed8);
    this->m_pNamedBufferSubData = *(PFNGLNAMEDBUFFERSUBDATA *)(lVar17 + 0xee0);
    this->m_pUnmapNamedBuffer = *(PFNGLUNMAPNAMEDBUFFER *)(lVar17 + 0x1678);
    if (((this->m_pClearNamedBufferData == (PFNGLCLEARNAMEDBUFFERDATA)0x0) ||
        (((this->m_pClearNamedBufferSubData == (PFNGLCLEARNAMEDBUFFERSUBDATA)0x0 ||
          (this->m_pCopyNamedBufferSubData == (PFNGLCOPYNAMEDBUFFERSUBDATA)0x0)) ||
         (this->m_pFlushMappedNamedBufferRange == (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)0x0)))) ||
       ((((this->m_pGetNamedBufferParameteri64v == (PFNGLGETNAMEDBUFFERPARAMETERI64V)0x0 ||
          (this->m_pGetNamedBufferParameteriv == (PFNGLGETNAMEDBUFFERPARAMETERIV)0x0)) ||
         (this->m_pGetNamedBufferPointerv == (PFNGLGETNAMEDBUFFERPOINTERV)0x0)) ||
        (((this->m_pGetNamedBufferSubData == (PFNGLGETNAMEDBUFFERSUBDATA)0x0 ||
          (this->m_pMapNamedBuffer == (PFNGLMAPNAMEDBUFFER)0x0)) ||
         (((this->m_pMapNamedBufferRange == (PFNGLMAPNAMEDBUFFERRANGE)0x0 ||
           (((this->m_pNamedBufferData == (PFNGLNAMEDBUFFERDATA)0x0 ||
             (this->m_pNamedBufferStorage == (PFNGLNAMEDBUFFERSTORAGE)0x0)) ||
            (this->m_pNamedBufferSubData == (PFNGLNAMEDBUFFERSUBDATA)0x0)))) ||
          (this->m_pUnmapNamedBuffer == (PFNGLUNMAPNAMEDBUFFER)0x0)))))))) {
      puVar18 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar18 = 0;
      __cxa_throw(puVar18,&int::typeinfo,0);
    }
    bVar1 = TestErrorsOfClearNamedBufferData(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar2 = TestErrorsOfClearNamedBufferSubData(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar3 = TestErrorsOfCopyNamedBufferSubData(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar4 = TestErrorsOfCreateBuffers(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar5 = TestErrorsOfFlushMappedNamedBufferRange(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar6 = TestErrorsOfGetNamedBufferParameter(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar7 = TestErrorsOfGetNamedBufferPointerv(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar8 = TestErrorsOfGetNamedBufferSubData(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar9 = TestErrorsOfMapNamedBuffer(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar10 = TestErrorsOfMapNamedBufferRange(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar11 = TestErrorsOfNamedBufferData(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar12 = TestErrorsOfNamedBufferStorage(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar13 = TestErrorsOfNamedBufferSubData(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    bVar14 = TestErrorsOfUnmapNamedBuffer(this);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    do {
      iVar15 = (**(code **)(lVar17 + 0x800))();
    } while (iVar15 != 0);
    if (((((((((((((bVar1 && bVar2) && bVar3) && bVar4) && bVar5) && bVar6) && bVar7) && bVar8) &&
            bVar9) && bVar10) && bVar11) && bVar12) && bVar13) && bVar14) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* API function pointers setup. */
	m_pClearNamedBufferData		   = (PFNGLCLEARNAMEDBUFFERDATA)gl.clearNamedBufferData;
	m_pClearNamedBufferSubData	 = (PFNGLCLEARNAMEDBUFFERSUBDATA)gl.clearNamedBufferSubData;
	m_pCopyNamedBufferSubData	  = (PFNGLCOPYNAMEDBUFFERSUBDATA)gl.copyNamedBufferSubData;
	m_pFlushMappedNamedBufferRange = (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)gl.flushMappedNamedBufferRange;
	m_pGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64V)gl.getNamedBufferParameteri64v;
	m_pGetNamedBufferParameteriv   = (PFNGLGETNAMEDBUFFERPARAMETERIV)gl.getNamedBufferParameteriv;
	m_pGetNamedBufferPointerv	  = (PFNGLGETNAMEDBUFFERPOINTERV)gl.getNamedBufferPointerv;
	m_pGetNamedBufferSubData	   = (PFNGLGETNAMEDBUFFERSUBDATA)gl.getNamedBufferSubData;
	m_pMapNamedBuffer			   = (PFNGLMAPNAMEDBUFFER)gl.mapNamedBuffer;
	m_pMapNamedBufferRange		   = (PFNGLMAPNAMEDBUFFERRANGE)gl.mapNamedBufferRange;
	m_pNamedBufferData			   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pNamedBufferStorage		   = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pNamedBufferSubData		   = (PFNGLNAMEDBUFFERSUBDATA)gl.namedBufferSubData;
	m_pUnmapNamedBuffer			   = (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;

	try
	{
		/* API function pointers check. */
		if ((DE_NULL == m_pClearNamedBufferData) || (DE_NULL == m_pClearNamedBufferSubData) ||
			(DE_NULL == m_pCopyNamedBufferSubData) || (DE_NULL == m_pFlushMappedNamedBufferRange) ||
			(DE_NULL == m_pGetNamedBufferParameteri64v) || (DE_NULL == m_pGetNamedBufferParameteriv) ||
			(DE_NULL == m_pGetNamedBufferPointerv) || (DE_NULL == m_pGetNamedBufferSubData) ||
			(DE_NULL == m_pMapNamedBuffer) || (DE_NULL == m_pMapNamedBufferRange) || (DE_NULL == m_pNamedBufferData) ||
			(DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pNamedBufferSubData) ||
			(DE_NULL == m_pUnmapNamedBuffer))
		{
			throw 0;
		}

		/* Running test cases.                              Cleaning errors. */
		is_ok &= TestErrorsOfClearNamedBufferData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfClearNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfCopyNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfCreateBuffers();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfFlushMappedNamedBufferRange();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfGetNamedBufferParameter();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfGetNamedBufferPointerv();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfGetNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfMapNamedBuffer();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfMapNamedBufferRange();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfNamedBufferData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfNamedBufferStorage();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfUnmapNamedBuffer();
		while (gl.getError())
			;
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}